

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::Event::armLast(Event *this)

{
  bool bVar1;
  long *in_FS_OFFSET;
  bool local_71;
  anon_class_8_1_8991fb9c local_70 [3];
  Fault local_58;
  Fault f;
  EventLoop **local_48;
  DebugComparison<kj::EventLoop_*&,_kj::EventLoop_*> local_40;
  bool local_11;
  Event *pEStack_10;
  bool _kjCondition;
  Event *this_local;
  
  pEStack_10 = this;
  local_48 = (EventLoop **)
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                        (EventLoop **)(*in_FS_OFFSET + -0x28));
  f.exception = (Exception *)this->loop;
  DebugExpression<kj::EventLoop*&>::operator==
            (&local_40,(DebugExpression<kj::EventLoop*&> *)&local_48,(EventLoop **)&f);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)&local_40);
  local_71 = true;
  if (!bVar1) {
    local_71 = *(long *)(*in_FS_OFFSET + -0x28) == 0;
  }
  local_11 = local_71;
  if (local_71 != false) {
    if (this->live != 0x1e366381) {
      local_70[0].this = this;
      armLast::anon_class_8_1_8991fb9c::operator()(local_70);
    }
    if (this->prev == (Event **)0x0) {
      this->next = *this->loop->breadthFirstInsertPoint;
      this->prev = this->loop->breadthFirstInsertPoint;
      *this->prev = this;
      if (this->next != (Event *)0x0) {
        this->next->prev = &this->next;
      }
      if (this->loop->tail == this->prev) {
        this->loop->tail = &this->next;
      }
      EventLoop::setRunnable(this->loop,true);
    }
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[111]>
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x8c2,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
             "_kjCondition,\"Event armed from different thread than it was created in.  You must use \" \"Executor to queue events cross-thread.\""
             ,&local_11,
             (char (*) [111])
             "Event armed from different thread than it was created in.  You must use Executor to queue events cross-thread."
            );
  Debug::Fault::fatal(&local_58);
}

Assistant:

void Event::armLast() {
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Event armed from different thread than it was created in.  You must use "
             "Executor to queue events cross-thread.");
  if (live != MAGIC_LIVE_VALUE) {
    ([this]() noexcept {
      KJ_FAIL_ASSERT("tried to arm Event after it was destroyed", location);
    })();
  }

  if (prev == nullptr) {
    next = *loop.breadthFirstInsertPoint;
    prev = loop.breadthFirstInsertPoint;
    *prev = this;
    if (next != nullptr) {
      next->prev = &next;
    }

    // We don't update loop.breadthFirstInsertPoint because we want further inserts to go *before*
    // this event.

    if (loop.tail == prev) {
      loop.tail = &next;
    }

    loop.setRunnable(true);
  }
}